

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppPrinter.cpp
# Opt level: O2

void __thiscall hdc::CppPrinter::visit(CppPrinter *this,LiteralSymbolExpression *expression)

{
  ostream *poVar1;
  string *psVar2;
  undefined1 auStack_48 [48];
  
  this->isExpression = true;
  poVar1 = std::operator<<((ostream *)&this->field_0x20,'\"');
  LiteralExpression::get_token((Token *)auStack_48,&expression->super_LiteralExpression);
  psVar2 = Token::getLexem_abi_cxx11_((Token *)auStack_48);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  std::operator<<(poVar1,'\"');
  std::__cxx11::string::~string((string *)(auStack_48 + 0x10));
  return;
}

Assistant:

void CppPrinter::visit(LiteralSymbolExpression* expression) {
    isExpression = true;
    output << '"' << expression->get_token().getLexem() << '"';
}